

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_miniscript_or_b(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  miniscript_node_t *pmVar2;
  miniscript_node_t *pmVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  iVar4 = 0;
  pmVar2 = node->child;
  for (pmVar3 = pmVar2; pmVar3 != (miniscript_node_t *)0x0; pmVar3 = pmVar3->next) {
    iVar4 = iVar4 + 1;
  }
  bVar7 = iVar4 == node->info->inner_num;
  if (bVar7) {
    uVar1 = pmVar2->type_properties;
    uVar6 = pmVar2->next->type_properties;
    uVar5 = uVar6 & uVar1;
    node->type_properties =
         (uint)((~uVar6 & 0x808) == 0 && (~uVar1 & 0x801) == 0) + (uVar5 & 0xa100) + 0x21800;
    uVar6 = uVar6 | uVar1;
    if ((uVar6 >> 8 & 1) != 0) {
      node->type_properties = node->type_properties | uVar6 & 0x200;
    }
    if (((short)uVar6 < 0) && ((uVar5 & 0x2000) != 0)) {
      node->type_properties = node->type_properties | uVar5 & 0x10000;
    }
    return 0;
  }
  return (uint)bVar7 * 2 + -2;
}

Assistant:

static int verify_miniscript_or_b(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop, y_prop;
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret != WALLY_OK)
        return ret;

    x_prop = node->child->type_properties;
    y_prop = node->child->next->type_properties;
    node->type_properties = MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_X;
    node->type_properties |= x_prop & y_prop &
                             (MINISCRIPT_PROPERTY_Z | MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_E);
    if (!(~x_prop & (MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D)) &&
        !(~y_prop & (MINISCRIPT_TYPE_W | MINISCRIPT_PROPERTY_D)))
        node->type_properties |= MINISCRIPT_TYPE_B;
    if ((x_prop | y_prop) & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_O;
    if (((x_prop | y_prop) & MINISCRIPT_PROPERTY_S) &&
        ((x_prop & y_prop) & MINISCRIPT_PROPERTY_E))
        node->type_properties |= x_prop & y_prop & MINISCRIPT_PROPERTY_M;

    return WALLY_OK;
}